

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)74,(moira::Mode)11,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  Ea<(moira::Mode)11,_2> result;
  u32 local_24;
  ushort local_20;
  uint local_1c;
  
  SVar1 = str->style->syntax;
  if (SVar1 - GNU < 2) {
    cVar4 = 'm';
    lVar5 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "fdmove"[lVar5 + 3];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = 'w';
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "$%x.w"[lVar5 + 4];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    local_20 = op & 7;
    local_24 = *addr;
    *addr = local_24 + 2;
    local_1c = (*this->_vptr_Moira[6])();
    local_1c = local_1c & 0xffff;
    StrWriter::operator<<(str,(Ea<(moira::Mode)11,_2> *)&local_24);
  }
  else {
    if (SVar1 == MUSASHI) {
      cVar4 = 'm';
      lVar5 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "fdmove"[lVar5 + 3];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
    }
    else {
      cVar4 = 'm';
      lVar5 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = "fdmove"[lVar5 + 3];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if (str->style->syntax - MOIRA_MIT < 3) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = 'w';
      }
      else {
        cVar4 = '.';
        lVar5 = 0;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = cVar4;
          cVar4 = "$%x.w"[lVar5 + 4];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 2);
      }
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar3 = str->ptr;
          str->ptr = pcVar3 + 1;
          *pcVar3 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
    }
    local_20 = op & 7;
    local_24 = *addr;
    *addr = local_24 + 2;
    local_1c = (*this->_vptr_Moira[6])();
    local_1c = local_1c & 0xffff;
    StrWriter::operator<<(str,(Ea<(moira::Mode)11,_1> *)&local_24);
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = _____________xxx(op);

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, S>(src, addr) << Sep{} << Ccr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
    }
}